

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_arena.pb.cc
# Opt level: O0

void __thiscall proto3_arena_unittest::TestAllTypes::Clear(TestAllTypes *this)

{
  uint32_t *puVar1;
  LogMessage *pLVar2;
  LogMessage local_d0;
  Voidify local_ba;
  byte local_b9;
  LogMessage local_b8;
  Voidify local_a2;
  byte local_a1;
  LogMessage local_a0;
  Voidify local_8a;
  byte local_89;
  LogMessage local_88;
  Voidify local_72;
  byte local_71;
  LogMessage local_70;
  Voidify local_5a;
  byte local_59;
  LogMessage local_58;
  Voidify local_45 [20];
  byte local_31;
  LogMessage local_30;
  Voidify local_1d;
  uint local_1c;
  TestAllTypes *pTStack_18;
  uint32_t cached_has_bits;
  TestAllTypes *this_local;
  
  this_local = (TestAllTypes *)&this->field_0;
  local_1c = 0;
  pTStack_18 = this;
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_int32_);
  google::protobuf::RepeatedField<long>::Clear(&(this->field_0)._impl_.repeated_int64_);
  google::protobuf::RepeatedField<unsigned_int>::Clear(&(this->field_0)._impl_.repeated_uint32_);
  google::protobuf::RepeatedField<unsigned_long>::Clear(&(this->field_0)._impl_.repeated_uint64_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_sint32_);
  google::protobuf::RepeatedField<long>::Clear(&(this->field_0)._impl_.repeated_sint64_);
  google::protobuf::RepeatedField<unsigned_int>::Clear(&(this->field_0)._impl_.repeated_fixed32_);
  google::protobuf::RepeatedField<unsigned_long>::Clear(&(this->field_0)._impl_.repeated_fixed64_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_sfixed32_);
  google::protobuf::RepeatedField<long>::Clear(&(this->field_0)._impl_.repeated_sfixed64_);
  google::protobuf::RepeatedField<float>::Clear(&(this->field_0)._impl_.repeated_float_);
  google::protobuf::RepeatedField<double>::Clear(&(this->field_0)._impl_.repeated_double_);
  google::protobuf::RepeatedField<bool>::Clear(&(this->field_0)._impl_.repeated_bool_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&(this->field_0)._impl_.repeated_string_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&(this->field_0)._impl_.repeated_bytes_);
  google::protobuf::RepeatedPtrField<proto3_arena_unittest::TestAllTypes_NestedMessage>::Clear
            (&(this->field_0)._impl_.repeated_nested_message_);
  google::protobuf::RepeatedPtrField<proto3_arena_unittest::ForeignMessage>::Clear
            (&(this->field_0)._impl_.repeated_foreign_message_);
  google::protobuf::RepeatedPtrField<proto2_unittest_import::ImportMessage>::Clear
            (&(this->field_0)._impl_.repeated_import_message_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_nested_enum_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_foreign_enum_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&(this->field_0)._impl_.repeated_string_piece_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&(this->field_0)._impl_.repeated_cord_);
  google::protobuf::RepeatedPtrField<proto3_arena_unittest::TestAllTypes_NestedMessage>::Clear
            (&(this->field_0)._impl_.repeated_lazy_message_);
  puVar1 = google::protobuf::internal::HasBits<2>::operator[](&(this->field_0)._impl_._has_bits_,0);
  local_1c = *puVar1;
  if ((local_1c & 0xff) != 0) {
    if ((local_1c & 1) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.optional_string_);
    }
    if ((local_1c & 2) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.optional_bytes_);
    }
    if ((local_1c & 4) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.optional_string_piece_);
    }
    if ((local_1c & 8) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.optional_cord_);
    }
    if ((local_1c & 0x10) != 0) {
      local_31 = 0;
      if ((this->field_0)._impl_.optional_nested_message_ == (TestAllTypes_NestedMessage *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3_arena.pb.cc"
                   ,0x6e5,"_impl_.optional_nested_message_ != nullptr");
        local_31 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_1d,pLVar2);
      }
      if ((local_31 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_30);
      }
      proto3_arena_unittest::TestAllTypes_NestedMessage::Clear
                ((this->field_0)._impl_.optional_nested_message_);
    }
    if ((local_1c & 0x20) != 0) {
      local_59 = 0;
      if ((this->field_0)._impl_.optional_foreign_message_ == (ForeignMessage *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_58,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3_arena.pb.cc"
                   ,0x6e9,"_impl_.optional_foreign_message_ != nullptr");
        local_59 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
        absl::lts_20250127::log_internal::Voidify::operator&&(local_45,pLVar2);
      }
      if ((local_59 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_58);
      }
      proto3_arena_unittest::ForeignMessage::Clear((this->field_0)._impl_.optional_foreign_message_)
      ;
    }
    if ((local_1c & 0x40) != 0) {
      local_71 = 0;
      if ((this->field_0)._impl_.optional_import_message_ == (ImportMessage *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_70,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3_arena.pb.cc"
                   ,0x6ed,"_impl_.optional_import_message_ != nullptr");
        local_71 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_70);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_5a,pLVar2);
      }
      if ((local_71 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_70);
      }
      proto2_unittest_import::ImportMessage::Clear((this->field_0)._impl_.optional_import_message_);
    }
    if ((local_1c & 0x80) != 0) {
      local_89 = 0;
      if ((this->field_0)._impl_.optional_public_import_message_ == (PublicImportMessage *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_88,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3_arena.pb.cc"
                   ,0x6f1,"_impl_.optional_public_import_message_ != nullptr");
        local_89 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_88);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_72,pLVar2);
      }
      if ((local_89 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_88);
      }
      proto2_unittest_import::PublicImportMessage::Clear
                ((this->field_0)._impl_.optional_public_import_message_);
    }
  }
  if ((local_1c & 0x300) != 0) {
    if ((local_1c & 0x100) != 0) {
      local_a1 = 0;
      if ((this->field_0)._impl_.optional_lazy_message_ == (TestAllTypes_NestedMessage *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3_arena.pb.cc"
                   ,0x6f7,"_impl_.optional_lazy_message_ != nullptr");
        local_a1 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_8a,pLVar2);
      }
      if ((local_a1 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_a0);
      }
      proto3_arena_unittest::TestAllTypes_NestedMessage::Clear
                ((this->field_0)._impl_.optional_lazy_message_);
    }
    if ((local_1c & 0x200) != 0) {
      local_b9 = 0;
      if ((this->field_0)._impl_.optional_unverified_lazy_message_ ==
          (TestAllTypes_NestedMessage *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3_arena.pb.cc"
                   ,0x6fb,"_impl_.optional_unverified_lazy_message_ != nullptr");
        local_b9 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_a2,pLVar2);
      }
      if ((local_b9 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_b8);
      }
      proto3_arena_unittest::TestAllTypes_NestedMessage::Clear
                ((this->field_0)._impl_.optional_unverified_lazy_message_);
    }
  }
  if ((local_1c & 0xfc00) != 0) {
    memset((void *)((long)&this->field_0 + 0x250),0,0x24);
  }
  if ((local_1c & 0xff0000) != 0) {
    memset((void *)((long)&this->field_0 + 0x274),0,0x2c);
  }
  if ((local_1c & 0x3f000000) != 0) {
    memset((void *)((long)&this->field_0 + 0x2a0),0,8);
    if ((local_1c & 0x4000000) != 0) {
      absl::lts_20250127::Cord::Clear(&(this->field_0)._impl_.optional_bytes_cord_);
    }
    if ((local_1c & 0x8000000) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.proto3_optional_string_);
    }
    if ((local_1c & 0x10000000) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.proto3_optional_bytes_);
    }
    if ((local_1c & 0x20000000) != 0) {
      if ((this->field_0)._impl_.optional_lazy_import_message_ == (ImportMessage *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3_arena.pb.cc"
                   ,0x717,"_impl_.optional_lazy_import_message_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_d0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_ba,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_d0);
      }
      proto2_unittest_import::ImportMessage::Clear
                ((this->field_0)._impl_.optional_lazy_import_message_);
    }
  }
  if ((local_1c & 0xc0000000) != 0) {
    memset((void *)((long)&this->field_0 + 0x2d0),0,0xc);
  }
  puVar1 = google::protobuf::internal::HasBits<2>::operator[](&(this->field_0)._impl_._has_bits_,1);
  local_1c = *puVar1;
  if ((local_1c & 0xff) != 0) {
    memset((void *)((long)&this->field_0 + 0x2dc),0,0x30);
  }
  if ((local_1c & 0x300) != 0) {
    memset((void *)((long)&this->field_0 + 0x30c),0,0xc);
  }
  clear_oneof_field(this);
  google::protobuf::internal::HasBits<2>::Clear(&(this->field_0)._impl_._has_bits_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestAllTypes::Clear() {
// @@protoc_insertion_point(message_clear_start:proto3_arena_unittest.TestAllTypes)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.repeated_int32_.Clear();
  _impl_.repeated_int64_.Clear();
  _impl_.repeated_uint32_.Clear();
  _impl_.repeated_uint64_.Clear();
  _impl_.repeated_sint32_.Clear();
  _impl_.repeated_sint64_.Clear();
  _impl_.repeated_fixed32_.Clear();
  _impl_.repeated_fixed64_.Clear();
  _impl_.repeated_sfixed32_.Clear();
  _impl_.repeated_sfixed64_.Clear();
  _impl_.repeated_float_.Clear();
  _impl_.repeated_double_.Clear();
  _impl_.repeated_bool_.Clear();
  _impl_.repeated_string_.Clear();
  _impl_.repeated_bytes_.Clear();
  _impl_.repeated_nested_message_.Clear();
  _impl_.repeated_foreign_message_.Clear();
  _impl_.repeated_import_message_.Clear();
  _impl_.repeated_nested_enum_.Clear();
  _impl_.repeated_foreign_enum_.Clear();
  _impl_.repeated_string_piece_.Clear();
  _impl_.repeated_cord_.Clear();
  _impl_.repeated_lazy_message_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.optional_string_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _impl_.optional_bytes_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _impl_.optional_string_piece_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _impl_.optional_cord_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(_impl_.optional_nested_message_ != nullptr);
      _impl_.optional_nested_message_->Clear();
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      ABSL_DCHECK(_impl_.optional_foreign_message_ != nullptr);
      _impl_.optional_foreign_message_->Clear();
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      ABSL_DCHECK(_impl_.optional_import_message_ != nullptr);
      _impl_.optional_import_message_->Clear();
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      ABSL_DCHECK(_impl_.optional_public_import_message_ != nullptr);
      _impl_.optional_public_import_message_->Clear();
    }
  }
  if ((cached_has_bits & 0x00000300u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      ABSL_DCHECK(_impl_.optional_lazy_message_ != nullptr);
      _impl_.optional_lazy_message_->Clear();
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      ABSL_DCHECK(_impl_.optional_unverified_lazy_message_ != nullptr);
      _impl_.optional_unverified_lazy_message_->Clear();
    }
  }
  if ((cached_has_bits & 0x0000fc00u) != 0) {
    ::memset(&_impl_.optional_int64_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.optional_sint32_) -
        reinterpret_cast<char*>(&_impl_.optional_int64_)) + sizeof(_impl_.optional_sint32_));
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    ::memset(&_impl_.optional_fixed32_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.optional_nested_enum_) -
        reinterpret_cast<char*>(&_impl_.optional_fixed32_)) + sizeof(_impl_.optional_nested_enum_));
  }
  if ((cached_has_bits & 0x3f000000u) != 0) {
    ::memset(&_impl_.optional_foreign_enum_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.proto3_optional_float_) -
        reinterpret_cast<char*>(&_impl_.optional_foreign_enum_)) + sizeof(_impl_.proto3_optional_float_));
    if ((cached_has_bits & 0x04000000u) != 0) {
      _impl_.optional_bytes_cord_.Clear();
    }
    if ((cached_has_bits & 0x08000000u) != 0) {
      _impl_.proto3_optional_string_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x10000000u) != 0) {
      _impl_.proto3_optional_bytes_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x20000000u) != 0) {
      ABSL_DCHECK(_impl_.optional_lazy_import_message_ != nullptr);
      _impl_.optional_lazy_import_message_->Clear();
    }
  }
  if ((cached_has_bits & 0xc0000000u) != 0) {
    ::memset(&_impl_.proto3_optional_int64_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.proto3_optional_int32_) -
        reinterpret_cast<char*>(&_impl_.proto3_optional_int64_)) + sizeof(_impl_.proto3_optional_int32_));
  }
  cached_has_bits = _impl_._has_bits_[1];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    ::memset(&_impl_.proto3_optional_uint32_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.proto3_optional_sfixed32_) -
        reinterpret_cast<char*>(&_impl_.proto3_optional_uint32_)) + sizeof(_impl_.proto3_optional_sfixed32_));
  }
  if ((cached_has_bits & 0x00000300u) != 0) {
    ::memset(&_impl_.proto3_optional_bool_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.proto3_optional_double_) -
        reinterpret_cast<char*>(&_impl_.proto3_optional_bool_)) + sizeof(_impl_.proto3_optional_double_));
  }
  clear_oneof_field();
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}